

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::cleanup_auto_fwd_pkgs(raft_server *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  element_type *peVar6;
  element_type *peVar7;
  long lVar8;
  long in_RDI;
  shared_ptr<nuraft::rpc_client> *ee_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
  *__range2_1;
  shared_ptr<nuraft::rpc_client> *ee;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
  *__range2;
  lock_guard<std::mutex> guard_1;
  ptr<auto_fwd_pkg> pkg;
  pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
  *__range1;
  lock_guard<std::mutex> guard;
  unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
  *in_stack_fffffffffffffea8;
  list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
  *in_stack_fffffffffffffeb0;
  EventAwaiter *in_stack_fffffffffffffec0;
  string local_f8 [32];
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  element_type *local_c0;
  string local_b8 [32];
  reference local_98;
  _Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false> local_90;
  _Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false> local_88;
  unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
  *local_80;
  string local_78 [72];
  reference local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
  local_20;
  long local_18;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffeb0,
             (mutex_type *)in_stack_fffffffffffffea8);
  local_18 = in_RDI + 0x250;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
       ::begin(in_stack_fffffffffffffea8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
       ::end(in_stack_fffffffffffffea8);
  while (bVar2 = std::__detail::operator!=(&local_20,&local_28), bVar2) {
    local_30 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
                            *)0x2012f8);
    std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::shared_ptr
              ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffeb0,
               (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffea8);
    std::
    __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x201328);
    EventAwaiter::invoke(in_stack_fffffffffffffec0);
    std::
    __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x201343);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffeb0,
               (mutex_type *)in_stack_fffffffffffffea8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x201384);
      iVar3 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar3) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2013b4);
        uVar1 = local_30->first;
        std::
        __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2013d9);
        sVar4 = std::
                unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                ::size((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                        *)0x2013e5);
        std::
        __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2013f4);
        sVar5 = std::__cxx11::
                list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                ::size(in_stack_fffffffffffffeb0);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,"srv %d, in-use %zu, idle %zu",(ulong)uVar1,sVar4,sVar5);
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"cleanup_auto_fwd_pkgs",0x16d,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    peVar6 = std::
             __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2014c5);
    local_80 = &peVar6->rpc_client_in_use_;
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
         ::begin((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                  *)in_stack_fffffffffffffea8);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
         ::end((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                *)in_stack_fffffffffffffea8);
    while (bVar2 = std::__detail::operator!=(&local_88,&local_90), bVar2) {
      local_98 = std::__detail::_Node_iterator<std::shared_ptr<nuraft::rpc_client>,_true,_false>::
                 operator*((_Node_iterator<std::shared_ptr<nuraft::rpc_client>,_true,_false> *)
                           0x201526);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x201559);
        iVar3 = (*peVar7->_vptr_logger[7])();
        if (5 < iVar3) {
          in_stack_fffffffffffffec0 =
               (EventAwaiter *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x201589);
          lVar8 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::use_count
                            ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                             0x20159b);
          msg_if_given_abi_cxx11_((char *)local_b8,"use count %zu",lVar8);
          (*(*(_func_int ***)in_stack_fffffffffffffec0)[8])
                    (in_stack_fffffffffffffec0,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"cleanup_auto_fwd_pkgs",0x16f,local_b8);
          std::__cxx11::string::~string(local_b8);
        }
      }
      std::__detail::_Node_iterator<std::shared_ptr<nuraft::rpc_client>,_true,_false>::operator++
                ((_Node_iterator<std::shared_ptr<nuraft::rpc_client>,_true,_false> *)
                 in_stack_fffffffffffffeb0);
    }
    local_c0 = std::
               __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x20163d);
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
         ::begin((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                  *)in_stack_fffffffffffffea8);
    local_d0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
         ::end((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                *)in_stack_fffffffffffffea8);
    while (bVar2 = std::operator!=(&local_c8,&local_d0), bVar2) {
      local_d8 = std::_List_iterator<std::shared_ptr<nuraft::rpc_client>_>::operator*
                           ((_List_iterator<std::shared_ptr<nuraft::rpc_client>_> *)0x20169a);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2016cd);
        iVar3 = (*peVar7->_vptr_logger[7])();
        if (5 < iVar3) {
          in_stack_fffffffffffffeb0 =
               (list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                *)std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2016fd);
          lVar8 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::use_count
                            ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                             0x20170f);
          msg_if_given_abi_cxx11_((char *)local_f8,"use count %zu",lVar8);
          (*(code *)(((element_type *)
                     (in_stack_fffffffffffffeb0->
                     super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next)->rpc_client_in_use_)._M_h.
                    _M_rehash_policy._M_next_resize)
                    (in_stack_fffffffffffffeb0,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"cleanup_auto_fwd_pkgs",0x172,local_f8);
          std::__cxx11::string::~string(local_f8);
        }
      }
      std::_List_iterator<std::shared_ptr<nuraft::rpc_client>_>::operator++(&local_c8);
    }
    std::
    __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2017a2);
    std::__cxx11::
    list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
    ::clear(in_stack_fffffffffffffeb0);
    std::
    __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2017b7);
    std::
    unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
    ::clear((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
             *)0x2017c3);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2017d0);
    std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::~shared_ptr
              ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)0x2017dd);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
                  *)in_stack_fffffffffffffeb0);
  }
  std::
  unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
  ::clear((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
           *)0x201829);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x201836);
  return;
}

Assistant:

void raft_server::cleanup_auto_fwd_pkgs() {
    auto_lock(rpc_clients_lock_);
    for (auto& entry: auto_fwd_pkgs_) {
        ptr<auto_fwd_pkg> pkg = entry.second;
        pkg->ea_.invoke();
        auto_lock(pkg->lock_);
        p_in("srv %d, in-use %zu, idle %zu",
             entry.first,
             pkg->rpc_client_in_use_.size(),
             pkg->rpc_client_idle_.size());
        for (auto& ee: pkg->rpc_client_in_use_) {
            p_tr("use count %zu", ee.use_count());
        }
        for (auto& ee: pkg->rpc_client_idle_) {
            p_tr("use count %zu", ee.use_count());
        }
        pkg->rpc_client_idle_.clear();
        pkg->rpc_client_in_use_.clear();
    }
    auto_fwd_pkgs_.clear();
}